

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float2 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  string *psVar1;
  _Base_ptr __k;
  bool bVar2;
  __type _Var3;
  int iVar4;
  size_type sVar5;
  value_type *value;
  ostream *poVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  UsdPrimvarReader_float2 *args;
  UsdPrimvarReader_float2 *pUVar8;
  PrimVar *var;
  _Rb_tree_header *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  allocator local_5c1;
  string *local_5c0;
  _Base_ptr local_5b8;
  ParseResult ret;
  string local_568;
  optional<tinyusdz::Animatable<std::array<float,2ul>>> *local_548;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_540;
  string *local_538;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_530;
  string *local_528;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  ParseResult sret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  string local_488 [32];
  string local_468 [32];
  string local_448;
  ostringstream ss_e;
  undefined1 local_420 [368];
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> tok_attr;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = preader;
  local_5c0 = err;
  local_538 = warn;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&tok_attr,"info:id",(allocator *)&ss_e);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tok_attr);
  ::std::__cxx11::string::_M_dispose();
  p_Var9 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  local_530 = &(preader->fallback)._paths;
  local_548 = (optional<tinyusdz::Animatable<std::array<float,2ul>>> *)&(preader->fallback)._attrib;
  local_528 = (string *)&preader->result;
  local_540 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
  for (p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var9;
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
    local_5b8 = p_Var7 + 1;
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_5b8,"inputs:varname");
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&tok_attr,"inputs:varname",(allocator *)&ss_e);
      sVar5 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)&tok_attr);
      ::std::__cxx11::string::_M_dispose();
      if (sVar5 != 0) goto LAB_001daf7e;
      TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute(&tok_attr);
      ::std::__cxx11::string::string((string *)&local_448,(string *)local_5b8);
      pUVar8 = (UsdPrimvarReader_float2 *)(p_Var7 + 2);
      ::std::__cxx11::string::string((string *)&ss_e,"inputs:varname",(allocator *)&sret);
      args = pUVar8;
      warn = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                (&ret,&table,&local_448,(Property *)pUVar8,(string *)&ss_e,&tok_attr);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (ret.code == TypeMismatch) {
        ::std::__cxx11::string::string(local_468,(string *)local_5b8);
        ::std::__cxx11::string::string((string *)&ss_e,"inputs:varname",(allocator *)&local_568);
        warn = (string *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                  (&sret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_468,(string *)pUVar8,(Property *)&ss_e,(string *)&preader->varname,
                   in_stack_fffffffffffffa28);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar4 = 3;
        args = pUVar8;
        if (sret.code != Success) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1098);
          ::std::operator<<(poVar6," ");
          ::std::__cxx11::string::string
                    ((string *)&local_4f0,"Faied to parse inputs:varname: {}",&local_5c1);
          fmt::format<std::__cxx11::string>
                    (&local_568,(fmt *)&local_4f0,(string *)&sret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pUVar8);
          poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&local_568);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_5c0;
          args = pUVar8;
          if (local_5c0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&local_568,&local_4f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_568);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            args = pUVar8;
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar4 = 1;
        }
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        iVar4 = 0;
        if (ret.code == Success) {
          bVar2 = ConvertTokenAttributeToStringAttribute(&tok_attr,&preader->varname);
          iVar4 = 3;
          if (!bVar2) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1086);
            ::std::operator<<(poVar6," ");
            poVar6 = ::std::operator<<((ostream *)&ss_e,
                                       "Failed to convert inputs:varname token type to string type."
                                      );
            ::std::operator<<(poVar6,"\n");
            psVar1 = local_5c0;
            if (local_5c0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &sret,&local_568,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar1);
              ::std::__cxx11::string::operator=((string *)psVar1,(string *)&sret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar4 = 1;
          }
        }
      }
      ::std::__cxx11::string::_M_dispose();
      TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute(&tok_attr);
      if (iVar4 == 0) goto LAB_001daf7e;
LAB_001dba8c:
      if ((iVar4 != 3) && (iVar4 != 0)) break;
    }
    else {
LAB_001daf7e:
      ::std::__cxx11::string::string((string *)&local_4a8,(string *)local_5b8);
      pUVar8 = (UsdPrimvarReader_float2 *)(p_Var7 + 2);
      ::std::__cxx11::string::string((string *)&local_568,"inputs:fallback",(allocator *)&local_4f0)
      ;
      ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
      ret.err._M_string_length = 0;
      ret.err.field_2._M_local_buf[0] = '\0';
      iVar4 = ::std::__cxx11::string::compare((string *)&local_4a8);
      if (iVar4 == 0) {
        if (((ulong)p_Var7[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          ret.code = PropertyTypeMismatch;
          ::std::__cxx11::string::string
                    ((string *)&ss_e,
                     "Property `{}` must be Attribute, but declared as Relationship.",
                     (allocator *)&sret);
          fmt::format<std::__cxx11::string>
                    ((string *)&tok_attr,(fmt *)&ss_e,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&tok_attr);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        if (p_Var7[6]._M_left != p_Var7[6]._M_parent) {
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (local_530,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var7[6]._M_parent
                    );
          ret.code = Success;
        }
        Attribute::type_name_abi_cxx11_((string *)&sret,(Attribute *)pUVar8);
        tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&tok_attr,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&sret);
        if (_Var3) {
          ::std::__cxx11::string::_M_dispose();
LAB_001db269:
          iVar4 = *(int *)((long)&p_Var7[0x17]._M_parent + 4);
          if (iVar4 == 1) {
            bVar2 = Attribute::is_blocked((Attribute *)pUVar8);
            if (bVar2) {
              (preader->fallback)._blocked = true;
            }
            bVar2 = primvar::PrimVar::has_value((PrimVar *)&p_Var7[4]._M_parent);
            if ((bVar2) || (p_Var7[5]._M_left != p_Var7[5]._M_parent)) {
              (anonymous_namespace)::ConvertToAnimatable<std::array<float,2ul>>
                        ((optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)&ss_e,
                         (_anonymous_namespace_ *)&p_Var7[4]._M_parent,var);
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
              optional<tinyusdz::Animatable<std::array<float,_2UL>_>,_0>
                        ((optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)&tok_attr,
                         (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)&ss_e);
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
              ~optional((optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)&ss_e);
              bVar2 = tok_attr._metas.interpolation.has_value_;
              if (tok_attr._metas.interpolation.has_value_ == true) {
                value = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::value
                                  ((optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                                   &tok_attr);
                nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,2ul>>>::
                operator=(local_548,value);
              }
              else {
                ret.code = InternalError;
                ::std::__cxx11::string::assign((char *)&ret.err);
              }
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
              ~optional((optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)&tok_attr);
              if (bVar2 != false) goto LAB_001db5eb;
            }
            else if (p_Var7[6]._M_left != p_Var7[6]._M_parent) {
              AttrMetas::operator=(&(preader->fallback)._metas,(AttrMetas *)(p_Var7 + 7));
              __v = &local_4a8;
              goto LAB_001db608;
            }
          }
          else if (iVar4 == 0) {
            (preader->fallback)._value_empty = true;
LAB_001db5eb:
            __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_568;
            AttrMetas::operator=(&(preader->fallback)._metas,(AttrMetas *)(p_Var7 + 7));
LAB_001db608:
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,__v);
            ret.code = Success;
          }
          else {
            ::std::__cxx11::string::assign((char *)&ret.err);
            ret.code = InternalError;
          }
        }
        else {
          tinyusdz::value::TypeTraits<std::array<float,2ul>>::underlying_type_name_abi_cxx11_();
          _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ss_e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&sret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (_Var3) goto LAB_001db269;
          ret.code = TypeMismatch;
          ::std::__cxx11::stringstream::stringstream((stringstream *)&tok_attr);
          poVar6 = ::std::operator<<((ostream *)&tok_attr._metas.hidden,"Property type mismatch. ");
          poVar6 = ::std::operator<<(poVar6,(string *)&local_568);
          poVar6 = ::std::operator<<(poVar6," expects type `");
          tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
          poVar6 = ::std::operator<<(poVar6,(string *)&ss_e);
          poVar6 = ::std::operator<<(poVar6,"` but defined as type `");
          poVar6 = ::std::operator<<(poVar6,(string *)&sret);
          ::std::operator<<(poVar6,"`");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringstream::~stringstream((stringstream *)&tok_attr);
        }
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ret.code = Unmatched;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar4 = 3;
LAB_001db76b:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&tok_attr);
          poVar6 = ::std::operator<<((ostream *)&tok_attr,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x109e);
          ::std::operator<<(poVar6," ");
          ::std::__cxx11::string::string
                    ((string *)&sret,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_568);
          args = (UsdPrimvarReader_float2 *)&ret.err;
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)&ss_e,(fmt *)&sret,(string *)"inputs:fallback",(char (*) [16])args,
                     warn);
          poVar6 = ::std::operator<<((ostream *)&tok_attr,(string *)&ss_e);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_5c0;
          if (local_5c0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ss_e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&sret,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tok_attr);
          iVar4 = 1;
          goto LAB_001db76b;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar2) goto LAB_001dba8c;
      ::std::__cxx11::string::string(local_488,(string *)local_5b8);
      ::std::__cxx11::string::string((string *)&tok_attr,"outputs:result",(allocator *)&ret);
      args = pUVar8;
      warn = (string *)&tok_attr;
      (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                ((ParseResult *)&ss_e,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_488,(string *)pUVar8,(Property *)&tok_attr,local_528,
                 (TypedTerminalAttribute<std::array<float,_2UL>_> *)in_stack_fffffffffffffa28);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((_ss_e & 0xfffffffd) == 0) {
        iVar4 = 3;
LAB_001db91f:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (_ss_e != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&tok_attr);
          poVar6 = ::std::operator<<((ostream *)&tok_attr,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x10a0);
          ::std::operator<<(poVar6," ");
          ::std::__cxx11::string::string
                    ((string *)&sret,"Parsing shader output property `{}` failed. Error: {}",
                     (allocator *)&local_568);
          args = (UsdPrimvarReader_float2 *)local_420;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&sret,(string *)"outputs:result",(char (*) [15])args,warn
                    );
          poVar6 = ::std::operator<<((ostream *)&tok_attr,(string *)&ret);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_5c0;
          if (local_5c0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&sret,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tok_attr);
          iVar4 = 1;
          goto LAB_001db91f;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      __k = local_5b8;
      if (!bVar2) goto LAB_001dba8c;
      sVar5 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)local_5b8);
      if (sVar5 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](local_540,(key_type *)__k);
        Property::operator=(this,(Property *)pUVar8);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
      }
      sVar5 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__k);
      if (sVar5 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&tok_attr);
        poVar6 = ::std::operator<<((ostream *)&tok_attr,"[warn]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructShader");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x10a2);
        ::std::operator<<(poVar6," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                         "Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        poVar6 = ::std::operator<<((ostream *)&tok_attr,(string *)&ss_e);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::_M_dispose();
        psVar1 = local_538;
        if (local_538 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5c0);
          ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tok_attr);
      }
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return (_Rb_tree_header *)p_Var7 == p_Var9;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float2>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float2 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("Primreader_float2 prop = " << prop.first);
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float2,
                   preader->fallback)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float2, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}